

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsObject::QGraphicsObject(QGraphicsObject *this,QGraphicsItem *parent)

{
  QGraphicsItemPrivate *this_00;
  
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsPixmapItem_00811500;
  this_00 = (QGraphicsItemPrivate *)operator_new(0x178);
  QGraphicsItemPrivate::QGraphicsItemPrivate(this_00);
  *(QGraphicsItemPrivate **)(this + 0x18) = this_00;
  this_00->q_ptr = (QGraphicsItem *)(this + 0x10);
  QGraphicsItem::setParentItem((QGraphicsItem *)(this + 0x10),parent);
  *(undefined ***)this = &PTR_metaObject_00811638;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsObject_008116a8;
  *(ulong *)(*(long *)(this + 0x18) + 0x160) =
       *(ulong *)(*(long *)(this + 0x18) + 0x160) | 0x100000000000000;
  return;
}

Assistant:

QGraphicsObject::QGraphicsObject(QGraphicsItem *parent)
        : QGraphicsItem(parent)
{
    QGraphicsItem::d_ptr->isObject = true;
}